

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

QList<QByteArray> * __thiscall
QTimeZonePrivate::availableTimeZoneIds(QTimeZonePrivate *this,Territory territory)

{
  long *in_RSI;
  QList<QByteArray> *in_RDI;
  long in_FS_OFFSET;
  Territory in_stack_0000001e;
  QTimeZonePrivate *in_stack_00000020;
  QList<QByteArray> *in_stack_00000028;
  QList<QByteArrayView> *in_stack_00000030;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  matchingTimeZoneIds(in_stack_00000020,in_stack_0000001e);
  (**(code **)(*in_RSI + 0xa8))(local_38);
  selectAvailable(in_stack_00000030,in_stack_00000028);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x73a2bc);
  QList<QByteArrayView>::~QList((QList<QByteArrayView> *)0x73a2c6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArray> QTimeZonePrivate::availableTimeZoneIds(QLocale::Territory territory) const
{
    return selectAvailable(matchingTimeZoneIds(territory), availableTimeZoneIds());
}